

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

int Gia_ManNodeIfToGia_rec
              (Gia_Man_t *pNew,If_Man_t *pIfMan,If_Obj_t *pIfObj,Vec_Ptr_t *vVisited,int fHash)

{
  If_Cut_t *pIVar1;
  If_Obj_t **ppIVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  void **ppvVar7;
  If_Obj_t *pIVar8;
  
  fVar6 = (pIfObj->CutBest).Area;
  if (fVar6 == 0.0) {
    pIVar1 = &pIfObj->CutBest;
    uVar4 = vVisited->nSize;
    if (uVar4 == vVisited->nCap) {
      if ((int)uVar4 < 0x10) {
        if (vVisited->pArray == (void **)0x0) {
          ppvVar7 = (void **)malloc(0x80);
        }
        else {
          ppvVar7 = (void **)realloc(vVisited->pArray,0x80);
        }
        vVisited->pArray = ppvVar7;
        vVisited->nCap = 0x10;
      }
      else {
        if (vVisited->pArray == (void **)0x0) {
          ppvVar7 = (void **)malloc((ulong)uVar4 << 4);
        }
        else {
          ppvVar7 = (void **)realloc(vVisited->pArray,(ulong)uVar4 << 4);
        }
        vVisited->pArray = ppvVar7;
        vVisited->nCap = uVar4 * 2;
      }
    }
    else {
      ppvVar7 = vVisited->pArray;
    }
    iVar3 = vVisited->nSize;
    vVisited->nSize = iVar3 + 1;
    ppvVar7[iVar3] = pIVar1;
    (pIfObj->CutBest).Area = -NAN;
    fVar6 = -NAN;
    pIVar8 = pIfObj;
    if (((undefined1  [112])*pIfObj & (undefined1  [112])0xf) != (undefined1  [112])0x2) {
      do {
        uVar4 = Gia_ManNodeIfToGia_rec(pNew,pIfMan,pIVar8->pFanin0,vVisited,fHash);
        if ((uVar4 != 0xffffffff) &&
           (uVar5 = Gia_ManNodeIfToGia_rec(pNew,pIfMan,pIVar8->pFanin1,vVisited,fHash),
           uVar5 != 0xffffffff)) {
          if (fHash == 0) {
            if (((int)uVar4 < 0) || ((int)uVar5 < 0)) goto LAB_00210b5b;
            fVar6 = (float)Gia_ManAppendAnd(pNew,*(uint *)pIVar8 >> 4 & 1 ^ uVar4,
                                            *(uint *)pIVar8 >> 5 & 1 ^ uVar5);
          }
          else {
            if (((int)uVar4 < 0) || ((int)uVar5 < 0)) {
LAB_00210b5b:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x132,"int Abc_LitNotCond(int, int)");
            }
            fVar6 = (float)Gia_ManHashAnd(pNew,*(uint *)pIVar8 >> 4 & 1 ^ uVar4,
                                          *(uint *)pIVar8 >> 5 & 1 ^ uVar5);
          }
          if (((*(uint *)pIfObj ^ *(uint *)pIVar8) & 0x40) != 0) {
            if ((int)fVar6 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x131,"int Abc_LitNot(int)");
            }
            fVar6 = (float)((uint)fVar6 ^ 1);
          }
          pIVar1->Area = fVar6;
          return (int)fVar6;
        }
        ppIVar2 = &pIVar8->pEquiv;
        pIVar8 = *ppIVar2;
      } while (*ppIVar2 != (If_Obj_t *)0x0);
      fVar6 = pIVar1->Area;
    }
  }
  return (int)fVar6;
}

Assistant:

int Gia_ManNodeIfToGia_rec( Gia_Man_t * pNew, If_Man_t * pIfMan, If_Obj_t * pIfObj, Vec_Ptr_t * vVisited, int fHash )
{
    If_Cut_t * pCut;
    If_Obj_t * pTemp;
    int iFunc, iFunc0, iFunc1;
    // get the best cut
    pCut = If_ObjCutBest(pIfObj);
    // if the cut is visited, return the result
    if ( If_CutDataInt(pCut) )
        return If_CutDataInt(pCut);
    // mark the node as visited
    Vec_PtrPush( vVisited, pCut );
    // insert the worst case
    If_CutSetDataInt( pCut, ~0 );
    // skip in case of primary input
    if ( If_ObjIsCi(pIfObj) )
        return If_CutDataInt(pCut);
    // compute the functions of the children
    for ( pTemp = pIfObj; pTemp; pTemp = pTemp->pEquiv )
    {
        iFunc0 = Gia_ManNodeIfToGia_rec( pNew, pIfMan, pTemp->pFanin0, vVisited, fHash );
        if ( iFunc0 == ~0 )
            continue;
        iFunc1 = Gia_ManNodeIfToGia_rec( pNew, pIfMan, pTemp->pFanin1, vVisited, fHash );
        if ( iFunc1 == ~0 )
            continue;
        // both branches are solved
        if ( fHash )
            iFunc = Gia_ManHashAnd( pNew, Abc_LitNotCond(iFunc0, pTemp->fCompl0), Abc_LitNotCond(iFunc1, pTemp->fCompl1) ); 
        else
            iFunc = Gia_ManAppendAnd( pNew, Abc_LitNotCond(iFunc0, pTemp->fCompl0), Abc_LitNotCond(iFunc1, pTemp->fCompl1) ); 
        if ( pTemp->fPhase != pIfObj->fPhase )
            iFunc = Abc_LitNot(iFunc);
        If_CutSetDataInt( pCut, iFunc );
        break;
    }
    return If_CutDataInt(pCut);
}